

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O0

void R_DrawSpanMaskedTranslucentP_C(void)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  DWORD *pDVar4;
  DWORD *pDVar5;
  lighttable_t *plVar6;
  dsfixed_t dVar7;
  dsfixed_t dVar8;
  BYTE *pBVar9;
  byte bVar10;
  uint uVar11;
  DWORD bg_1;
  DWORD fg_1;
  BYTE texdata_1;
  int xmask;
  BYTE xshift;
  BYTE yshift;
  DWORD bg;
  DWORD fg;
  BYTE texdata;
  DWORD *bg2rgb;
  DWORD *fg2rgb;
  int spot;
  int count;
  BYTE *colormap;
  BYTE *source;
  BYTE *dest;
  dsfixed_t ystep;
  dsfixed_t xstep;
  dsfixed_t yfrac;
  dsfixed_t xfrac;
  
  pBVar9 = ds_source;
  dVar8 = ds_ystep;
  dVar7 = ds_xstep;
  plVar6 = ds_colormap;
  pDVar5 = dc_destblend;
  pDVar4 = dc_srcblend;
  xstep = ds_xfrac;
  ystep = ds_yfrac;
  source = dc_destorg + (ylookup[ds_y] + ds_x1);
  fg2rgb._4_4_ = (ds_x2 - ds_x1) + 1;
  if ((ds_xbits == 6) && (ds_ybits == 6)) {
    do {
      bVar1 = pBVar9[(int)((xstep >> 0x14 & 0xfc0) + (ystep >> 0x1a))];
      if (bVar1 != 0) {
        uVar11 = pDVar4[plVar6[bVar1]] + pDVar5[*source] | 0x1f07c1f;
        *source = RGB32k.All[uVar11 & uVar11 >> 0xf];
      }
      source = source + 1;
      xstep = dVar7 + xstep;
      ystep = dVar8 + ystep;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
    } while (fg2rgb._4_4_ != 0);
  }
  else {
    bVar1 = (byte)ds_ybits;
    bVar10 = 0x20 - bVar1;
    bVar3 = (byte)ds_xbits;
    do {
      bVar2 = pBVar9[(int)((xstep >> (bVar10 - bVar3 & 0x1f) &
                           (1 << (bVar3 & 0x1f)) + -1 << (bVar1 & 0x1f)) +
                          (ystep >> (bVar10 & 0x1f)))];
      if (bVar2 != 0) {
        uVar11 = pDVar4[plVar6[bVar2]] + pDVar5[*source] | 0x1f07c1f;
        *source = RGB32k.All[uVar11 & uVar11 >> 0xf];
      }
      source = source + 1;
      xstep = dVar7 + xstep;
      ystep = dVar8 + ystep;
      fg2rgb._4_4_ = fg2rgb._4_4_ + -1;
    } while (fg2rgb._4_4_ != 0);
  }
  return;
}

Assistant:

void R_DrawSpanMaskedTranslucentP_C (void)
{
	dsfixed_t			xfrac;
	dsfixed_t			yfrac;
	dsfixed_t			xstep;
	dsfixed_t			ystep;
	BYTE*				dest;
	const BYTE*			source = ds_source;
	const BYTE*			colormap = ds_colormap;
	int 				count;
	int 				spot;
	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	xfrac = ds_xfrac;
	yfrac = ds_yfrac;

	dest = ylookup[ds_y] + ds_x1 + dc_destorg;

	count = ds_x2 - ds_x1 + 1;

	xstep = ds_xstep;
	ystep = ds_ystep;

	if (ds_xbits == 6 && ds_ybits == 6)
	{
		// 64x64 is the most common case by far, so special case it.
		do
		{
			BYTE texdata;

			spot = ((xfrac>>(32-6-6))&(63*64)) + (yfrac>>(32-6));
			texdata = source[spot];
			if (texdata != 0)
			{
				DWORD fg = colormap[texdata];
				DWORD bg = *dest;
				fg = fg2rgb[fg];
				bg = bg2rgb[bg];
				fg = (fg+bg) | 0x1f07c1f;
				*dest = RGB32k.All[fg & (fg>>15)];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
	else
	{
		BYTE yshift = 32 - ds_ybits;
		BYTE xshift = yshift - ds_xbits;
		int xmask = ((1 << ds_xbits) - 1) << ds_ybits;
		do
		{
			BYTE texdata;
		
			spot = ((xfrac >> xshift) & xmask) + (yfrac >> yshift);
			texdata = source[spot];
			if (texdata != 0)
			{
				DWORD fg = colormap[texdata];
				DWORD bg = *dest;
				fg = fg2rgb[fg];
				bg = bg2rgb[bg];
				fg = (fg+bg) | 0x1f07c1f;
				*dest = RGB32k.All[fg & (fg>>15)];
			}
			dest++;
			xfrac += xstep;
			yfrac += ystep;
		} while (--count);
	}
}